

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_type_pattern(lysp_ctx *ctx,lysp_stmt *stmt,lysp_restr **patterns)

{
  ly_stmt stmt_00;
  lysp_restr *plVar1;
  lysp_stmt *stmt_01;
  lyd_node *plVar2;
  yang_arg arg;
  LY_ERR LVar3;
  long *plVar4;
  size_t __n;
  char *pcVar5;
  ly_set *plVar6;
  char *pcVar7;
  uint32_t substmt_index;
  long lVar8;
  ly_ctx *plVar9;
  lysp_ext_instance *plVar10;
  lysp_ext_instance **in_R9;
  lysp_ext_instance **exts;
  lysp_stmt **pplVar11;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  plVar1 = *patterns;
  if (plVar1 == (lysp_restr *)0x0) {
    plVar4 = (long *)malloc(0x48);
    if (plVar4 == (long *)0x0) goto LAB_00168d3e;
    *plVar4 = 1;
    lVar8 = 1;
LAB_00168c9d:
    *patterns = (lysp_restr *)(plVar4 + 1);
    plVar4[lVar8 * 8 + -1] = 0;
    (plVar4 + lVar8 * 8 + -1)[1] = 0;
    plVar4[lVar8 * 8 + -3] = 0;
    (plVar4 + lVar8 * 8 + -3)[1] = 0;
    plVar4[lVar8 * 8 + -5] = 0;
    (plVar4 + lVar8 * 8 + -5)[1] = 0;
    plVar4[lVar8 * 8 + -7] = 0;
    (plVar4 + lVar8 * 8 + -7)[1] = 0;
    pcVar7 = stmt->arg;
    __n = strlen(pcVar7);
    pcVar5 = (char *)malloc(__n + 2);
    if (pcVar5 != (char *)0x0) {
      memmove(pcVar5 + 1,pcVar7,__n);
      *pcVar5 = '\x06';
      pcVar5[__n + 1] = '\0';
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert_zc(plVar9,pcVar5,(char **)(plVar4 + lVar8 * 8 + -7));
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      exts = (lysp_ext_instance **)(plVar4 + lVar8 * 8);
      exts[-6] = (lysp_ext_instance *)
                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      pplVar11 = &stmt->child;
      arg = (yang_arg)exts;
      do {
        stmt_01 = *pplVar11;
        if (stmt_01 == (lysp_stmt *)0x0) {
          return LY_SUCCESS;
        }
        stmt_00 = stmt_01->kw;
        substmt_index = arg - 8;
        if (((stmt_00 == LY_STMT_REFERENCE) ||
            (substmt_index = arg - 0x18, stmt_00 == LY_STMT_ERROR_APP_TAG)) ||
           (substmt_index = arg - 0x20, stmt_00 == LY_STMT_ERROR_MESSAGE)) {
LAB_00168eb9:
          LVar3 = lysp_stmt_text_field(ctx,stmt_01,substmt_index,(char **)0x2,arg,in_R9);
        }
        else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
          LVar3 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_PATTERN,0,exts);
        }
        else {
          if (stmt_00 != LY_STMT_MODIFIER) {
            substmt_index = arg - 0x10;
            if (stmt_00 != LY_STMT_DESCRIPTION) {
              if (ctx == (lysp_ctx *)0x0) {
                plVar9 = (ly_ctx *)0x0;
              }
              else {
                plVar9 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar7 = lyplg_ext_stmt2str(stmt_00);
              pcVar5 = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_00168f35:
              ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,pcVar5,pcVar7,"pattern");
              return LY_EVALID;
            }
            goto LAB_00168eb9;
          }
          plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          if (*(byte *)&plVar2[2].schema < 2) {
            plVar9 = (ly_ctx *)**(undefined8 **)plVar2;
            pcVar5 = 
            "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
            ;
            pcVar7 = "modifier";
            goto LAB_00168f35;
          }
          LVar3 = lysp_stmt_type_pattern_modifier
                            (ctx,stmt_01,(char **)(plVar4 + lVar8 * 8 + -7),exts);
        }
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        pplVar11 = &stmt_01->next;
      } while( true );
    }
    if (ctx == (lysp_ctx *)0x0) {
LAB_00168d6c:
      plVar9 = (ly_ctx *)0x0;
      goto LAB_00168d6e;
    }
    plVar6 = ctx->parsed_mods;
  }
  else {
    plVar10 = (lysp_ext_instance *)((long)&(plVar1[-1].exts)->name + 1);
    plVar1[-1].exts = plVar10;
    plVar4 = (long *)realloc(&plVar1[-1].exts,(long)plVar10 * 0x40 | 8);
    if (plVar4 != (long *)0x0) {
      lVar8 = *plVar4;
      goto LAB_00168c9d;
    }
    (*patterns)[-1].exts = (lysp_ext_instance *)((long)&(*patterns)[-1].exts[-1].exts + 7);
LAB_00168d3e:
    if (ctx == (lysp_ctx *)0x0) goto LAB_00168d6c;
    plVar6 = ctx->parsed_mods;
  }
  plVar9 = (ly_ctx *)**(undefined8 **)(plVar6->field_2).dnodes[plVar6->count - 1];
LAB_00168d6e:
  ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_pattern");
  return LY_EMEM;
}

Assistant:

static LY_ERR
lysp_stmt_type_pattern(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_restr **patterns)
{
    char *buf;
    size_t arg_len;
    struct lysp_restr *restr;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *patterns, restr, LY_EMEM);
    arg_len = strlen(stmt->arg);

    /* add special meaning first byte */
    buf = malloc(arg_len + 2);
    LY_CHECK_ERR_RET(!buf, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
    memmove(buf + 1, stmt->arg, arg_len);
    buf[0] = LYSP_RESTR_PATTERN_ACK; /* pattern's default regular-match flag */
    buf[arg_len + 1] = '\0'; /* terminating NULL byte */
    LY_CHECK_RET(lydict_insert_zc(PARSER_CTX(ctx), buf, &restr->arg.str));
    restr->arg.mod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->dsc, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->ref, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_ERROR_APP_TAG:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->eapptag, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_ERROR_MESSAGE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->emsg, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_MODIFIER:
            PARSER_CHECK_STMTVER2_RET(ctx, "modifier", "pattern");
            LY_CHECK_RET(lysp_stmt_type_pattern_modifier(ctx, child, &restr->arg.str, &restr->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_PATTERN, 0, &restr->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "pattern");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}